

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O2

int __thiscall
cpp_client::Connection::connect(Connection *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  ostream *poVar2;
  undefined4 in_register_00000034;
  
  if (__len != 0) {
    poVar2 = ::operator<<((ostream *)&std::cout,text_cyan);
    poVar2 = std::operator<<(poVar2,"Connecting to: ");
    poVar2 = std::operator<<(poVar2,(char *)CONCAT44(in_register_00000034,__fd));
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,'\n');
    ::operator<<(poVar2,normal);
  }
  iVar1 = Connection_internal::connect
                    ((this->conn_)._M_t.
                     super___uniq_ptr_impl<cpp_client::Connection_internal,_std::default_delete<cpp_client::Connection_internal>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_cpp_client::Connection_internal_*,_std::default_delete<cpp_client::Connection_internal>_>
                     .super__Head_base<0UL,_cpp_client::Connection_internal_*,_false>._M_head_impl,
                     __fd,(sockaddr *)((ulong)__addr & 0xffffffff),__len);
  return iVar1;
}

Assistant:

void Connection::connect(const char* host, unsigned port, bool print)
{
   if(print)
   {
      std::cout << sgr::text_cyan << "Connecting to: " << host << ":" << port << '\n' << sgr::reset;
   }
   conn_->connect(host, port);
}